

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

arg_hashtable_t * arg_hashtable_create(uint minsize,_func_uint_void_ptr *hashfn,arg_comparefn *eqfn)

{
  size_t size;
  long lVar1;
  arg_hashtable_t *paVar2;
  arg_hashtable_entry **__s;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  
  if (minsize < 0x40000001) {
    puVar3 = primes;
    uVar5 = 0x1a;
    for (lVar1 = 0; lVar1 != 0x1a; lVar1 = lVar1 + 1) {
      uVar4 = *puVar3;
      if (minsize < uVar4) {
        uVar5 = (uint)lVar1;
        goto LAB_00104870;
      }
      puVar3 = puVar3 + 1;
    }
    uVar4 = 0x35;
LAB_00104870:
    paVar2 = (arg_hashtable_t *)argtable3_xmalloc(0x30);
    size = (ulong)uVar4 * 8;
    __s = (arg_hashtable_entry **)argtable3_xmalloc(size);
    paVar2->table = __s;
    memset(__s,0,size);
    paVar2->tablelength = uVar4;
    paVar2->primeindex = uVar5;
    paVar2->entrycount = 0;
    paVar2->hashfn = hashfn;
    paVar2->eqfn = eqfn;
    dVar6 = ceil((double)uVar4 * 0.6499999761581421);
    paVar2->loadlimit = (uint)(long)dVar6;
  }
  else {
    paVar2 = (arg_hashtable_t *)0x0;
  }
  return paVar2;
}

Assistant:

arg_hashtable_t* arg_hashtable_create(unsigned int minsize, unsigned int (*hashfn)(const void*), int (*eqfn)(const void*, const void*)) {
    arg_hashtable_t* h;
    unsigned int pindex;
    unsigned int size = primes[0];

    /* Check requested hash table isn't too large */
    if (minsize > (1u << 30))
        return NULL;

    /*
     * Enforce size as prime. The reason is to avoid clustering of values
     * into a small number of buckets (yes, distribution). A more even
     *  distributed hash table will perform more consistently.
     */
    for (pindex = 0; pindex < prime_table_length; pindex++) {
        if (primes[pindex] > minsize) {
            size = primes[pindex];
            break;
        }
    }

    h = (arg_hashtable_t*)xmalloc(sizeof(arg_hashtable_t));
    h->table = (struct arg_hashtable_entry**)xmalloc(sizeof(struct arg_hashtable_entry*) * size);
    memset(h->table, 0, size * sizeof(struct arg_hashtable_entry*));
    h->tablelength = size;
    h->primeindex = pindex;
    h->entrycount = 0;
    h->hashfn = hashfn;
    h->eqfn = eqfn;
    h->loadlimit = (unsigned int)ceil(size * (double)max_load_factor);
    return h;
}